

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  uint32_t uVar1;
  VmaBlockMetadata *pVVar2;
  size_t sVar3;
  VmaBlockMetadata *pVVar4;
  VmaDefragmentationMove *pVVar5;
  VmaAllocHandle pVVar6;
  VmaSuballocationType suballocType;
  undefined6 uVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  VkResult VVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  VmaAllocationCreateFlags VVar15;
  ulong uVar16;
  VmaDeviceMemoryBlock *pVVar17;
  size_t sVar18;
  long lVar19;
  VkDeviceSize VStack_b0;
  size_t sStack_a8;
  VmaSuballocationType VStack_a0;
  VmaAllocationCreateFlags VStack_9c;
  VmaDefragmentationMoveOperation VStack_98;
  undefined4 uStack_94;
  VmaAllocation pVStack_90;
  VmaAllocation pVVar20;
  undefined8 uStack_80;
  size_t sStack_78;
  VmaDeviceMemoryBlock *pVStack_70;
  undefined1 auStack_68 [16];
  VmaRawList<VmaSuballocation> *pVStack_58;
  undefined8 uStack_50;
  void *pvStack_48;
  uint64_t uStack_40;
  ulong uStack_38;
  
  uVar1 = this->m_Algorithm;
  if (uVar1 != 8) {
    if (uVar1 != 4) {
      if (uVar1 != 1) {
        bVar8 = ComputeDefragmentation_Balanced(this,vector,index,true);
        return bVar8;
      }
      sVar18 = (vector->m_Blocks).m_Count - 1;
      if (this->m_ImmovableBlockCount < sVar18) {
        do {
          pVVar2 = (vector->m_Blocks).m_pArray[sVar18]->m_pMetadata;
          pVStack_70 = (VmaDeviceMemoryBlock *)0x1bd43f;
          iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
          lVar19 = CONCAT44(extraout_var,iVar10);
          while (lVar19 != 0) {
            pvStack_48 = (void *)((ulong)pvStack_48 & 0xffffffff00000000);
            uStack_38 = 0;
            pVStack_70 = (VmaDeviceMemoryBlock *)0x1bd469;
            iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
            uStack_40 = CONCAT44(extraout_var_00,iVar10);
            auStack_68._8_8_ = *(undefined8 *)(uStack_40 + 0x30);
            pVStack_58 = *(VmaRawList<VmaSuballocation> **)(uStack_40 + 0x28);
            iVar14 = (*(byte *)(uStack_40 + 0x4f) & 1) * 4;
            iVar10 = iVar14 + 0xc00;
            if ((*(byte *)(uStack_40 + 0x4f) & 2) == 0) {
              iVar10 = iVar14;
            }
            uStack_50 = (VmaListItem<VmaSuballocation> *)
                        CONCAT44(iVar10,(uint)*(byte *)(uStack_40 + 0x4d));
            if (*(VmaDefragmentationContext_T **)(uStack_40 + 0x38) != this) {
              if (this->m_MaxPassBytes < auStack_68._8_8_ + (this->m_PassStats).bytesMoved) {
                bVar9 = this->m_IgnoredAllocs + 1;
                this->m_IgnoredAllocs = bVar9;
                if (0xf < bVar9) {
                  return true;
                }
              }
              else {
                pVStack_70 = (VmaDeviceMemoryBlock *)0x1bd4d6;
                bVar8 = AllocInOtherBlock(this,0,sVar18,(MoveAllocationData *)(auStack_68 + 8),
                                          vector);
                if (bVar8) {
                  return true;
                }
              }
            }
            pVStack_70 = (VmaDeviceMemoryBlock *)0x1bd4e7;
            iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
            lVar19 = CONCAT44(extraout_var_01,iVar10);
          }
          sVar18 = sVar18 - 1;
        } while (this->m_ImmovableBlockCount < sVar18);
      }
      return false;
    }
    sVar18 = (vector->m_Blocks).m_Count - 1;
    if (this->m_ImmovableBlockCount < sVar18) {
      uStack_80 = &this->m_Moves;
      do {
        pVStack_70 = (vector->m_Blocks).m_pArray[sVar18];
        pVVar2 = pVStack_70->m_pMetadata;
        iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
        lVar19 = CONCAT44(extraout_var_02,iVar10);
        while (lVar19 != 0) {
          VStack_98 = VMA_DEFRAGMENTATION_MOVE_OPERATION_COPY;
          pVVar20 = (VmaAllocation)0x0;
          iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
          pVStack_90 = (VmaAllocation)CONCAT44(extraout_var_03,iVar10);
          VStack_b0 = pVStack_90->m_Size;
          sStack_a8 = pVStack_90->m_Alignment;
          VStack_a0 = (VmaSuballocationType)pVStack_90->m_SuballocationType;
          VVar15 = (pVStack_90->m_Flags & 1) * 4;
          VStack_9c = VVar15 + 0xc00;
          if ((pVStack_90->m_Flags & 2) == 0) {
            VStack_9c = VVar15;
          }
          if ((VmaDefragmentationContext_T *)pVStack_90->m_pUserData != this) {
            if (this->m_MaxPassBytes < VStack_b0 + (this->m_PassStats).bytesMoved) {
              bVar9 = this->m_IgnoredAllocs + 1;
              this->m_IgnoredAllocs = bVar9;
              if (0xf < bVar9) {
                return true;
              }
            }
            else {
              sVar3 = (this->m_Moves).m_Count;
              bVar8 = AllocInOtherBlock(this,0,sVar18,(MoveAllocationData *)&VStack_b0,vector);
              if (bVar8) {
                return true;
              }
              if (pVStack_90->m_Type == '\x01') {
                pVVar4 = ((pVStack_90->field_0).m_BlockAllocation.m_Block)->m_pMetadata;
                iVar10 = (*pVVar4->_vptr_VmaBlockMetadata[9])
                                   (pVVar4,(pVStack_90->field_0).m_BlockAllocation.m_AllocHandle);
                if (((CONCAT44(extraout_var_04,iVar10) != 0) && (sVar3 == (this->m_Moves).m_Count))
                   && (iVar14 = (*pVVar2->_vptr_VmaBlockMetadata[6])(pVVar2),
                      suballocType = VStack_a0, VStack_b0 <= CONCAT44(extraout_var_05,iVar14))) {
                  pvStack_48 = (void *)0x0;
                  uStack_40 = 0;
                  pVStack_58 = (VmaRawList<VmaSuballocation> *)0x0;
                  uStack_50 = (VmaListItem<VmaSuballocation> *)0x0;
                  auStack_68._0_8_ = (VmaAllocHandle)0x0;
                  auStack_68._8_8_ = 0;
                  uStack_38 = uStack_38 & 0xffffffff00000000;
                  sStack_78 = sStack_a8;
                  iVar14 = (*pVVar2->_vptr_VmaBlockMetadata[0x11])
                                     (pVVar2,VStack_b0,sStack_a8,0,(ulong)VStack_a0,0x40000,
                                      auStack_68);
                  if ((((char)iVar14 != '\0') &&
                      (iVar14 = (*pVVar2->_vptr_VmaBlockMetadata[9])(pVVar2,auStack_68._0_8_),
                      CONCAT44(extraout_var_06,iVar14) < CONCAT44(extraout_var_04,iVar10))) &&
                     (VVar11 = VmaBlockVector::CommitAllocationRequest
                                         (vector,(VmaAllocationRequest *)auStack_68,pVStack_70,
                                          sStack_78,VStack_9c,this,suballocType,
                                          (VmaAllocation *)&stack0xffffffffffffff78),
                     VVar11 == VK_SUCCESS)) {
                    sVar3 = (this->m_Moves).m_Count;
                    VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::
                    resize(uStack_80,sVar3 + 1);
                    pVVar5 = (this->m_Moves).m_pArray;
                    pVVar5[sVar3].dstTmpAllocation = pVVar20;
                    pVVar5 = pVVar5 + sVar3;
                    *(ulong *)pVVar5 = CONCAT44(uStack_94,VStack_98);
                    pVVar5->srcAllocation = pVStack_90;
                    uVar16 = this->m_MaxPassBytes;
                    uVar12 = (this->m_PassStats).bytesMoved + VStack_b0;
                    (this->m_PassStats).bytesMoved = uVar12;
                    uVar13 = (this->m_PassStats).allocationsMoved + 1;
                    (this->m_PassStats).allocationsMoved = uVar13;
                    if (this->m_MaxPassAllocations <= uVar13) {
                      return true;
                    }
                    if (uVar16 <= uVar12) {
                      return true;
                    }
                  }
                }
              }
            }
          }
          iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
          lVar19 = CONCAT44(extraout_var_07,iVar10);
        }
        sVar18 = sVar18 - 1;
      } while (this->m_ImmovableBlockCount < sVar18);
    }
    return false;
  }
VmaDefragmentationContext_T_ComputeDefragmentation_Extensive:
  if (vector->m_BufferImageGranularity == 1) {
    bVar8 = ComputeDefragmentation_Full(this,vector);
    return bVar8;
  }
  pVVar17 = (VmaDeviceMemoryBlock *)((long)this->m_AlgorithmState + index * 0x10);
  uStack_80._0_6_ = (uint6)uStack_80 & 0xffffffffff;
  uStack_80 = (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
              (ulong)(uint6)uStack_80;
  bVar9 = *(byte *)((long)this->m_AlgorithmState + index * 0x10);
  switch(bVar9) {
  case 0:
  case 1:
  case 2:
    sVar18 = *(size_t *)((long)pVVar17 + 8);
    if (sVar18 == 0xffffffffffffffff) {
      sVar18 = (vector->m_Blocks).m_Count;
    }
    else if (sVar18 == 0) {
      *(byte *)pVVar17 = 6;
      goto LAB_001bdcae;
    }
    uVar16 = sVar18 - 1;
    pVVar2 = (vector->m_Blocks).m_pArray[sVar18 - 1]->m_pMetadata;
    auStack_68._0_8_ = (this->m_Moves).m_Count;
    pVStack_90 = (VmaAllocation)0x1bdbe0;
    sStack_78 = index;
    pVStack_70 = pVVar17;
    iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
    lVar19 = CONCAT44(extraout_var_08,iVar10);
    index = sStack_78;
    pVVar17 = pVStack_70;
    pVVar6 = (VmaAllocHandle)auStack_68._0_8_;
    while (sStack_78 = index, pVStack_70 = pVVar17, auStack_68._0_8_ = pVVar6, lVar19 != 0) {
      pvStack_48 = (void *)((ulong)pvStack_48 & 0xffffffff00000000);
      uStack_38 = 0;
      pVStack_90 = (VmaAllocation)0x1bdc0a;
      iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[10])(pVVar2,lVar19);
      uStack_40 = CONCAT44(extraout_var_09,iVar10);
      auStack_68._8_8_ = *(undefined8 *)(uStack_40 + 0x30);
      pVStack_58 = *(VmaRawList<VmaSuballocation> **)(uStack_40 + 0x28);
      iVar14 = (*(byte *)(uStack_40 + 0x4f) & 1) * 4;
      iVar10 = iVar14 + 0xc00;
      if ((*(byte *)(uStack_40 + 0x4f) & 2) == 0) {
        iVar10 = iVar14;
      }
      uStack_50 = (VmaListItem<VmaSuballocation> *)
                  CONCAT44(iVar10,(uint)*(byte *)(uStack_40 + 0x4d));
      if (this->m_MaxPassBytes < auStack_68._8_8_ + (this->m_PassStats).bytesMoved) {
        bVar9 = this->m_IgnoredAllocs + 1;
        this->m_IgnoredAllocs = bVar9;
        if (0xf < bVar9) {
          return true;
        }
      }
      else {
        pVStack_90 = (VmaAllocation)0x1bdc73;
        bVar8 = AllocInOtherBlock(this,0,uVar16,(MoveAllocationData *)(auStack_68 + 8),vector);
        if (bVar8) {
          if ((VmaAllocHandle)auStack_68._0_8_ == (VmaAllocHandle)(this->m_Moves).m_Count) {
            return true;
          }
          pVStack_90 = (VmaAllocation)0x1bdd87;
          iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
          if (CONCAT44(extraout_var_11,iVar10) != 0) {
            return true;
          }
          *(ulong *)((long)this->m_AlgorithmState + sStack_78 * 8) = uVar16;
          return true;
        }
      }
      pVStack_90 = (VmaAllocation)0x1bdc88;
      iVar10 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,lVar19);
      index = sStack_78;
      pVVar17 = pVStack_70;
      pVVar6 = (VmaAllocHandle)auStack_68._0_8_;
      lVar19 = CONCAT44(extraout_var_10,iVar10);
    }
    if (pVVar6 == (VmaAllocHandle)(this->m_Moves).m_Count) {
      if (uVar16 < 2) goto LAB_001bdcae;
      lVar19 = sVar18 - 2;
      do {
        pVStack_90 = (VmaAllocation)0x1bdd57;
        bVar8 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar19]);
        if (bVar8) {
          return true;
        }
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      if (pVVar6 != (VmaAllocHandle)(this->m_Moves).m_Count) {
LAB_001bde57:
        bVar9 = *(byte *)pVVar17;
switchD_001bdb8e_caseD_6:
        if (bVar9 == 6) {
LAB_001bde67:
          if ((vector->m_Blocks).m_Count != 0) {
            sVar18 = (this->m_Moves).m_Count;
            uVar16 = 0;
            do {
              pVStack_90 = (VmaAllocation)0x1bde8e;
              bVar8 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar16]);
              if (bVar8) {
                return true;
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 < (vector->m_Blocks).m_Count);
            if (sVar18 != (this->m_Moves).m_Count) {
              return false;
            }
          }
          *(byte *)pVVar17 = 7;
        }
switchD_001bdb8e_caseD_7:
        return false;
      }
LAB_001bdcae:
      bVar8 = ComputeDefragmentation_Fast(this,vector);
      return bVar8;
    }
    bVar9 = 3;
    if (*(byte *)pVVar17 != 0) {
      bVar9 = *(byte *)pVVar17 == 2 | 4;
    }
    *(byte *)pVVar17 = bVar9;
    *(ulong *)((long)pVVar17 + 8) = uVar16;
    goto VmaDefragmentationContext_T_ComputeDefragmentation_Extensive;
  case 3:
switchD_001bdb8e_caseD_3:
    pVStack_90 = (VmaAllocation)0x1bddeb;
    bVar8 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)((long)pVVar17 + 8),
                       (bool *)((long)&uStack_80 + 7),(bool *)((long)&uStack_80 + 6),
                       (bool *)((long)&uStack_80 + 5));
    if (!bVar8) goto LAB_001bde57;
    if (uStack_80._6_1_ != '\x01') {
      if (uStack_80._5_1_ != '\x01') goto LAB_001bde62;
      *(byte *)pVVar17 = 5;
      uStack_80._0_6_ = (uint6)(uint5)uStack_80;
      goto switchD_001bdb8e_caseD_5;
    }
    break;
  case 4:
    pVStack_90 = (VmaAllocation)0x1bdcee;
    bVar8 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,
                       *(size_t *)((long)pVVar17 + 8),(bool *)((long)&uStack_80 + 7),
                       (bool *)((long)&uStack_80 + 6),(bool *)((long)&uStack_80 + 5));
    if (!bVar8) goto LAB_001bde57;
    if (uStack_80._7_1_ != 1) {
      if ((uStack_80._6_1_ != '\0') || (uStack_80._5_1_ == '\x01')) {
        *(byte *)pVVar17 = 3;
        uVar7 = (uint6)uStack_80;
        uStack_80 = (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                    ((ulong)uStack_80._7_1_ << 0x38);
        uStack_80 = (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                    (CONCAT26(uStack_80._6_2_,uVar7) & 0xffff00ffffffffff);
        goto switchD_001bdb8e_caseD_3;
      }
      goto LAB_001bde62;
    }
    *(byte *)pVVar17 = 1;
    goto VmaDefragmentationContext_T_ComputeDefragmentation_Extensive;
  case 5:
switchD_001bdb8e_caseD_5:
    pVStack_90 = (VmaAllocation)0x1bde2b;
    bVar8 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)((long)pVVar17 + 8),
                       (bool *)((long)&uStack_80 + 7),(bool *)((long)&uStack_80 + 6),
                       (bool *)((long)&uStack_80 + 5));
    if (!bVar8) goto LAB_001bde57;
    if (uStack_80._5_1_ != '\x01') {
LAB_001bde62:
      *(byte *)pVVar17 = 6;
      goto LAB_001bde67;
    }
    break;
  default:
    goto switchD_001bdb8e_caseD_6;
  case 7:
    goto switchD_001bdb8e_caseD_7;
  }
  *(byte *)pVVar17 = 0;
  goto VmaDefragmentationContext_T_ComputeDefragmentation_Extensive;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation(VmaBlockVector& vector, size_t index)
{
    switch (m_Algorithm)
    {
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FAST_BIT:
        return ComputeDefragmentation_Fast(vector);
    default:
        VMA_ASSERT(0);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
        return ComputeDefragmentation_Balanced(vector, index, true);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FULL_BIT:
        return ComputeDefragmentation_Full(vector);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
        return ComputeDefragmentation_Extensive(vector, index);
    }
}